

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
* __thiscall
node::anon_unknown_2::NodeImpl::listExternalSigners
          (vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
           *__return_storage_ptr__,NodeImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  ExternalSigner *pEVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  string chain;
  int iVar9;
  pointer *__ptr;
  ArgsManager *this_00;
  CChainParams *pCVar10;
  ExternalSigner *pEVar11;
  size_type __n;
  unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_> *puVar12;
  undefined8 *puVar13;
  pointer *__ptr_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined8 *puVar15;
  pointer pEVar16;
  unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_> *__cur;
  unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_> *puVar17;
  long in_FS_OFFSET;
  string command;
  undefined8 in_stack_fffffffffffffeb8;
  new_allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
  *pnVar18;
  undefined8 in_stack_fffffffffffffec0;
  pointer pEVar19;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  ExternalSigner *local_98;
  undefined8 local_90;
  ExternalSigner local_88;
  _func_int **pp_Stack_80;
  ExternalSigner *local_78;
  undefined8 local_70;
  ExternalSigner local_68;
  _func_int **pp_Stack_60;
  ExternalSigner *local_58;
  undefined8 local_50;
  ExternalSigner local_48;
  _func_int **pp_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar16 = (pointer)0x0;
  pEVar19 = (pointer)0x0;
  this_00 = args(this);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-signer","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  ArgsManager::GetArg(&local_d8,this_00,&local_b8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_d8,"");
  if (iVar9 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pCVar10 = Params();
    ChainTypeToString_abi_cxx11_(&local_118,pCVar10->m_chain_type);
    chain._M_string_length = in_stack_fffffffffffffec0;
    chain._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
    chain.field_2._M_allocated_capacity = (size_type)pEVar16;
    chain.field_2._8_8_ = pEVar19;
    ExternalSigner::Enumerate
              (&local_d8,
               (vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)&stack0xfffffffffffffec8,
               chain);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pnVar18 = (new_allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
               *)__return_storage_ptr__;
    std::
    vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    ::reserve(__return_storage_ptr__,(long)pEVar19 - (long)pEVar16 >> 7);
    if (pEVar16 != pEVar19) {
      do {
        paVar14 = &local_b8.field_2;
        pEVar11 = (ExternalSigner *)operator_new(0x88);
        local_b8._M_dataplus._M_p = (pEVar16->m_command)._M_dataplus._M_p;
        paVar1 = &(pEVar16->m_command).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar1) {
          local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&(pEVar16->m_command).field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)paVar14;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        pp_Var2 = (_func_int **)(pEVar16->m_command)._M_string_length;
        (pEVar16->m_command)._M_dataplus._M_p = (pointer)paVar1;
        (pEVar16->m_command)._M_string_length = 0;
        (pEVar16->m_command).field_2._M_local_buf[0] = '\0';
        local_98 = &local_88;
        pEVar3 = (ExternalSigner *)(pEVar16->m_chain)._M_dataplus._M_p;
        paVar1 = &(pEVar16->m_chain).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pEVar3 == paVar1) {
          local_88._vptr_ExternalSigner = (_func_int **)paVar1->_M_allocated_capacity;
          pp_Stack_80 = *(_func_int ***)((long)&(pEVar16->m_chain).field_2 + 8);
        }
        else {
          local_88._vptr_ExternalSigner = (_func_int **)paVar1->_M_allocated_capacity;
          local_98 = pEVar3;
        }
        pp_Var4 = (_func_int **)(pEVar16->m_chain)._M_string_length;
        (pEVar16->m_chain)._M_dataplus._M_p = (pointer)paVar1;
        (pEVar16->m_chain)._M_string_length = 0;
        (pEVar16->m_chain).field_2._M_local_buf[0] = '\0';
        local_78 = &local_68;
        pEVar3 = (ExternalSigner *)(pEVar16->m_fingerprint)._M_dataplus._M_p;
        paVar1 = &(pEVar16->m_fingerprint).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pEVar3 == paVar1) {
          local_68._vptr_ExternalSigner = (_func_int **)paVar1->_M_allocated_capacity;
          pp_Stack_60 = *(_func_int ***)((long)&(pEVar16->m_fingerprint).field_2 + 8);
        }
        else {
          local_68._vptr_ExternalSigner = (_func_int **)paVar1->_M_allocated_capacity;
          local_78 = pEVar3;
        }
        pp_Var5 = (_func_int **)(pEVar16->m_fingerprint)._M_string_length;
        (pEVar16->m_fingerprint)._M_dataplus._M_p = (pointer)paVar1;
        (pEVar16->m_fingerprint)._M_string_length = 0;
        (pEVar16->m_fingerprint).field_2._M_local_buf[0] = '\0';
        local_58 = &local_48;
        pEVar3 = (ExternalSigner *)(pEVar16->m_name)._M_dataplus._M_p;
        paVar1 = &(pEVar16->m_name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pEVar3 == paVar1) {
          local_48._vptr_ExternalSigner = (_func_int **)paVar1->_M_allocated_capacity;
          pp_Stack_40 = *(_func_int ***)((long)&(pEVar16->m_name).field_2 + 8);
        }
        else {
          local_48._vptr_ExternalSigner = (_func_int **)paVar1->_M_allocated_capacity;
          local_58 = pEVar3;
        }
        pp_Var6 = (_func_int **)(pEVar16->m_name)._M_string_length;
        (pEVar16->m_name)._M_dataplus._M_p = (pointer)paVar1;
        (pEVar16->m_name)._M_string_length = 0;
        (pEVar16->m_name).field_2._M_local_buf[0] = '\0';
        pEVar11->_vptr_ExternalSigner = (_func_int **)&PTR__ExternalSignerImpl_00b39130;
        pEVar11[1]._vptr_ExternalSigner = (_func_int **)(pEVar11 + 3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar14) {
          pEVar11[3]._vptr_ExternalSigner = (_func_int **)local_b8.field_2._M_allocated_capacity;
          pEVar11[4]._vptr_ExternalSigner = (_func_int **)local_b8.field_2._8_8_;
        }
        else {
          pEVar11[1]._vptr_ExternalSigner = (_func_int **)local_b8._M_dataplus._M_p;
          pEVar11[3]._vptr_ExternalSigner = (_func_int **)local_b8.field_2._M_allocated_capacity;
        }
        pEVar11[2]._vptr_ExternalSigner = pp_Var2;
        local_b8.field_2._M_allocated_capacity =
             local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pEVar11[5]._vptr_ExternalSigner = (_func_int **)(pEVar11 + 7);
        if (local_98 == &local_88) {
          pEVar11[7]._vptr_ExternalSigner = local_88._vptr_ExternalSigner;
          pEVar11[8]._vptr_ExternalSigner = pp_Stack_80;
        }
        else {
          pEVar11[5]._vptr_ExternalSigner = (_func_int **)local_98;
          pEVar11[7]._vptr_ExternalSigner = local_88._vptr_ExternalSigner;
        }
        pEVar11[6]._vptr_ExternalSigner = pp_Var4;
        local_88._vptr_ExternalSigner = local_88._vptr_ExternalSigner & 0xffffffffffffff00;
        pEVar11[9]._vptr_ExternalSigner = (_func_int **)(pEVar11 + 0xb);
        if (local_78 == &local_68) {
          pEVar11[0xb]._vptr_ExternalSigner = local_68._vptr_ExternalSigner;
          pEVar11[0xc]._vptr_ExternalSigner = pp_Stack_60;
        }
        else {
          pEVar11[9]._vptr_ExternalSigner = (_func_int **)local_78;
          pEVar11[0xb]._vptr_ExternalSigner = local_68._vptr_ExternalSigner;
        }
        pEVar11[10]._vptr_ExternalSigner = pp_Var5;
        local_68._vptr_ExternalSigner = local_68._vptr_ExternalSigner & 0xffffffffffffff00;
        pEVar11[0xd]._vptr_ExternalSigner = (_func_int **)(pEVar11 + 0xf);
        if (local_58 == &local_48) {
          pEVar11[0xf]._vptr_ExternalSigner = local_48._vptr_ExternalSigner;
          pEVar11[0x10]._vptr_ExternalSigner = pp_Stack_40;
        }
        else {
          pEVar11[0xd]._vptr_ExternalSigner = (_func_int **)local_58;
          pEVar11[0xf]._vptr_ExternalSigner = local_48._vptr_ExternalSigner;
        }
        pEVar11[0xe]._vptr_ExternalSigner = pp_Var6;
        local_48._vptr_ExternalSigner = local_48._vptr_ExternalSigner & 0xffffffffffffff00;
        local_50 = 0;
        local_70 = 0;
        local_90 = 0;
        local_b8._M_string_length = 0;
        puVar15 = *(undefined8 **)((long)__return_storage_ptr__ + 8);
        local_98 = &local_88;
        local_78 = &local_68;
        local_58 = &local_48;
        if (puVar15 == *(undefined8 **)((long)__return_storage_ptr__ + 0x10)) {
          local_b8._M_dataplus._M_p = (pointer)paVar14;
          __n = std::
                vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                ::_M_check_len(__return_storage_ptr__,1,"vector::_M_realloc_insert");
          puVar7 = *(undefined8 **)__return_storage_ptr__;
          puVar8 = *(undefined8 **)((long)__return_storage_ptr__ + 8);
          if (__n == 0) {
            puVar12 = (unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
                       *)0x0;
            __return_storage_ptr__ =
                 (vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                  *)pnVar18;
          }
          else {
            puVar12 = __gnu_cxx::
                      new_allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
                      ::allocate((new_allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
                                  *)__return_storage_ptr__,__n,(void *)0x0);
            __return_storage_ptr__ =
                 (vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                  *)pnVar18;
          }
          puVar12[(long)puVar15 - (long)puVar7 >> 3]._M_t.
          super___uniq_ptr_impl<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
          ._M_t.
          super__Tuple_impl<0UL,_interfaces::ExternalSigner_*,_std::default_delete<interfaces::ExternalSigner>_>
          .super__Head_base<0UL,_interfaces::ExternalSigner_*,_false>._M_head_impl = pEVar11;
          puVar17 = puVar12;
          for (puVar13 = puVar7; puVar13 != puVar15; puVar13 = puVar13 + 1) {
            (puVar17->_M_t).
            super___uniq_ptr_impl<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
            ._M_t.
            super__Tuple_impl<0UL,_interfaces::ExternalSigner_*,_std::default_delete<interfaces::ExternalSigner>_>
            .super__Head_base<0UL,_interfaces::ExternalSigner_*,_false>._M_head_impl =
                 (ExternalSigner *)*puVar13;
            *puVar13 = 0;
            puVar17 = puVar17 + 1;
          }
          for (; puVar17 = puVar17 + 1, puVar8 != puVar15; puVar15 = puVar15 + 1) {
            (puVar17->_M_t).
            super___uniq_ptr_impl<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
            ._M_t.
            super__Tuple_impl<0UL,_interfaces::ExternalSigner_*,_std::default_delete<interfaces::ExternalSigner>_>
            .super__Head_base<0UL,_interfaces::ExternalSigner_*,_false>._M_head_impl =
                 (ExternalSigner *)*puVar15;
            *puVar15 = 0;
          }
          pnVar18 = (new_allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
                     *)__return_storage_ptr__;
          if (puVar7 != (undefined8 *)0x0) {
            operator_delete(puVar7,(long)*(pointer *)((long)__return_storage_ptr__ + 0x10) -
                                   (long)puVar7);
          }
          *(unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
            **)__return_storage_ptr__ = puVar12;
          *(unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
            **)((long)__return_storage_ptr__ + 8) = puVar17;
          *(unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
            **)((long)__return_storage_ptr__ + 0x10) = puVar12 + __n;
        }
        else {
          *puVar15 = pEVar11;
          *(undefined8 **)((long)__return_storage_ptr__ + 8) = puVar15 + 1;
          local_b8._M_dataplus._M_p = (pointer)paVar14;
        }
        pEVar16 = pEVar16 + 1;
      } while (pEVar16 != pEVar19);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::~vector
            ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)&stack0xfffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
            *)(new_allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
               *)__return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<interfaces::ExternalSigner>> listExternalSigners() override
    {
#ifdef ENABLE_EXTERNAL_SIGNER
        std::vector<ExternalSigner> signers = {};
        const std::string command = args().GetArg("-signer", "");
        if (command == "") return {};
        ExternalSigner::Enumerate(command, signers, Params().GetChainTypeString());
        std::vector<std::unique_ptr<interfaces::ExternalSigner>> result;
        result.reserve(signers.size());
        for (auto& signer : signers) {
            result.emplace_back(std::make_unique<ExternalSignerImpl>(std::move(signer)));
        }
        return result;
#else
        // This result is indistinguishable from a successful call that returns
        // no signers. For the current GUI this doesn't matter, because the wallet
        // creation dialog disables the external signer checkbox in both
        // cases. The return type could be changed to std::optional<std::vector>
        // (or something that also includes error messages) if this distinction
        // becomes important.
        return {};
#endif // ENABLE_EXTERNAL_SIGNER
    }